

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor.hpp
# Opt level: O0

type __thiscall
jsoncons::csv::basic_csv_cursor<char,jsoncons::stream_source<char>,std::allocator<char>>::
reset<std::__cxx11::istringstream&>
          (basic_csv_cursor<char,_jsoncons::stream_source<char>,_std::allocator<char>_> *this,
          basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *source)

{
  uint uVar1;
  text_source_adaptor<jsoncons::stream_source<char>_> *in_RDI;
  text_source_adaptor<jsoncons::stream_source<char>_> *in_stack_fffffffffffffe50;
  basic_csv_parser<char,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  basic_staj_visitor<char> *in_stack_fffffffffffffe90;
  
  text_source_adaptor<jsoncons::stream_source<char>>::
  text_source_adaptor<std::__cxx11::istringstream&>
            (in_stack_fffffffffffffe50,
             (basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  text_source_adaptor<jsoncons::stream_source<char>_>::operator=(in_stack_fffffffffffffe50,in_RDI);
  text_source_adaptor<jsoncons::stream_source<char>_>::~text_source_adaptor
            ((text_source_adaptor<jsoncons::stream_source<char>_> *)0x43ffd1);
  basic_csv_parser<char,_std::allocator<char>_>::reinitialize(in_stack_fffffffffffffe80);
  basic_staj_visitor<char>::reset(in_stack_fffffffffffffe90);
  uVar1 = (*(in_RDI->source_).null_is_.super_basic_istream<char,_std::char_traits<char>_>.
            _vptr_basic_istream[3])();
  if ((uVar1 & 1) == 0) {
    (*(in_RDI->source_).null_is_.super_basic_istream<char,_std::char_traits<char>_>.
      _vptr_basic_istream[7])();
  }
  return;
}

Assistant:

typename std::enable_if<!std::is_constructible<jsoncons::basic_string_view<CharT>,Sourceable>::value>::type
    reset(Sourceable&& source)
    {
        source_ = std::forward<Sourceable>(source);
        parser_.reinitialize();
        cursor_visitor_.reset();
        if (!done())
        {
            next();
        }
    }